

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * __thiscall
testing::internal::FormatEpochTimeInMillisAsIso8601_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,TimeInMillis ms)

{
  bool bVar1;
  int value;
  int value_00;
  int value_01;
  int value_02;
  int value_03;
  string *__return_storage_ptr___00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd98;
  string local_250 [16];
  undefined8 in_stack_fffffffffffffdc0;
  undefined8 in_stack_fffffffffffffdc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd0;
  string local_210;
  string local_1f0;
  string local_1d0;
  int local_1ac;
  string local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  allocator<char> local_51;
  undefined1 local_50 [8];
  tm time_struct;
  TimeInMillis ms_local;
  
  time_struct.tm_zone = (char *)this;
  bVar1 = PortableLocaltime((long)this / 1000,(tm *)local_50);
  if (bVar1) {
    local_1ac = time_struct.tm_mday + 0x76c;
    __return_storage_ptr___00 = &local_1a8;
    StreamableToString<int>(__return_storage_ptr___00,&local_1ac);
    std::operator+(in_stack_fffffffffffffd98,(char *)__return_storage_ptr___00);
    String::FormatIntWidth2_abi_cxx11_(&local_1d0,(String *)(ulong)(time_struct.tm_hour + 1),value);
    std::operator+(&local_168,&local_188,&local_1d0);
    std::operator+(in_stack_fffffffffffffd98,(char *)__return_storage_ptr___00);
    String::FormatIntWidth2_abi_cxx11_
              (&local_1f0,(String *)(ulong)(uint)time_struct.tm_min,value_00);
    std::operator+(&local_128,&local_148,&local_1f0);
    std::operator+(in_stack_fffffffffffffd98,(char *)__return_storage_ptr___00);
    String::FormatIntWidth2_abi_cxx11_
              (&local_210,(String *)(ulong)(uint)time_struct.tm_sec,value_01);
    std::operator+(&local_e8,&local_108,&local_210);
    std::operator+(in_stack_fffffffffffffd98,(char *)__return_storage_ptr___00);
    String::FormatIntWidth2_abi_cxx11_
              ((string *)&stack0xfffffffffffffdd0,(String *)(ulong)(uint)local_50._4_4_,value_02);
    std::operator+(&local_a8,&local_c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xfffffffffffffdd0);
    std::operator+(in_stack_fffffffffffffd98,(char *)__return_storage_ptr___00);
    String::FormatIntWidth2_abi_cxx11_
              ((string *)local_250,(String *)(ulong)(uint)local_50._0_4_,value_03);
    std::operator+(__return_storage_ptr__,&local_88,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_250);
    std::__cxx11::string::~string(local_250);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffdd0);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::~string((string *)&local_1a8);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffdd0,(char *)in_stack_fffffffffffffdc8,
               (allocator<char> *)in_stack_fffffffffffffdc0);
    std::allocator<char>::~allocator(&local_51);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FormatEpochTimeInMillisAsIso8601(TimeInMillis ms) {
  struct tm time_struct;
  if (!PortableLocaltime(static_cast<time_t>(ms / 1000), &time_struct))
    return "";
  // YYYY-MM-DDThh:mm:ss
  return StreamableToString(time_struct.tm_year + 1900) + "-" +
      String::FormatIntWidth2(time_struct.tm_mon + 1) + "-" +
      String::FormatIntWidth2(time_struct.tm_mday) + "T" +
      String::FormatIntWidth2(time_struct.tm_hour) + ":" +
      String::FormatIntWidth2(time_struct.tm_min) + ":" +
      String::FormatIntWidth2(time_struct.tm_sec);
}